

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

Element __thiscall ui::LedPanel::Render(LedPanel *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  long in_RSI;
  Element EVar2;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  allocator_type local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  shared_ptr<ftxui::Node> local_110;
  undefined1 local_100 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_e0;
  string local_c8 [32];
  undefined1 local_a8 [48];
  undefined1 local_78 [16];
  Decorator local_68;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Select a LED:",&local_111);
  ftxui::text((string *)local_a8);
  std::__cxx11::string::string<std::allocator<char>>(local_c8," ",&local_112);
  EVar2 = ftxui::text((string *)local_100);
  (**(code **)(**(long **)(in_RSI + 0x48) + 0x10))
            (&local_110,*(long **)(in_RSI + 0x48),
             EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  ftxui::hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            ((ftxui *)(local_a8 + 0x10),(shared_ptr<ftxui::Node> *)local_100,&local_110);
  EVar2 = ftxui::separator();
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x10))
            (local_78,*(long **)(in_RSI + 0x58),
             EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  __l._M_len = 4;
  __l._M_array = (iterator)local_a8;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_e0,__l,&local_113);
  ftxui::vbox((Elements *)(local_100 + 0x10));
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_object = ftxui::frame;
  local_68._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::operator|((ftxui *)this,(Element *)(local_100 + 0x10),&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_e0);
  lVar1 = 0x38;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_48);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    return vbox({
               text("Select a LED:"),
               hbox(text(" "), radiobox_->Render()),
               separator(),
               led_tab_->Render(),
           }) |
           frame;
  }